

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

cpool_bundle * cpool_bundle_create(char *dest,size_t dest_len)

{
  cpool_bundle *bundle;
  size_t dest_len_local;
  char *dest_local;
  
  dest_local = (char *)(*Curl_ccalloc)(1,dest_len + 0x30);
  if ((Curl_llist *)dest_local == (Curl_llist *)0x0) {
    dest_local = (char *)0x0;
  }
  else {
    Curl_llist_init((Curl_llist *)dest_local,(Curl_llist_dtor)0x0);
    ((Curl_llist *)((long)dest_local + 0x20))->_head = (Curl_llist_node *)dest_len;
    memcpy(&((Curl_llist *)((long)dest_local + 0x20))->_tail,dest,dest_len);
  }
  return (cpool_bundle *)dest_local;
}

Assistant:

static struct cpool_bundle *cpool_bundle_create(const char *dest,
                                                size_t dest_len)
{
  struct cpool_bundle *bundle;
  bundle = calloc(1, sizeof(*bundle) + dest_len);
  if(!bundle)
    return NULL;
  Curl_llist_init(&bundle->conns, NULL);
  bundle->dest_len = dest_len;
  memcpy(bundle->dest, dest, dest_len);
  return bundle;
}